

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  bool bVar1;
  Token *pTVar2;
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined1 local_50 [48];
  string *local_20;
  string *identifier_local;
  ParserImpl *this_local;
  
  local_20 = identifier;
  identifier_local = (string *)this;
  bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::__cxx11::string::operator=((string *)local_20,(string *)&pTVar2->text);
    io::Tokenizer::Next(&this->tokenizer_);
    this_local._7_1_ = true;
  }
  else if (((((this->allow_field_number_ & 1U) == 0) && ((this->allow_unknown_field_ & 1U) == 0)) &&
           ((this->allow_unknown_extension_ & 1U) == 0)) ||
          (bVar1 = LookingAtType(this,TYPE_INTEGER), !bVar1)) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_80,"Expected identifier, got: ");
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_b0,&pTVar2->text);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_50,&local_80);
    local_50._32_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    ReportError(this,(string_view)local_50._32_16_);
    std::__cxx11::string::~string((string *)local_50);
    this_local._7_1_ = false;
  }
  else {
    pTVar2 = io::Tokenizer::current(&this->tokenizer_);
    std::__cxx11::string::operator=((string *)local_20,(string *)&pTVar2->text);
    io::Tokenizer::Next(&this->tokenizer_);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeIdentifier(std::string* identifier) {
    if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    // If allow_field_number_ or allow_unknown_field_ is true, we should able
    // to parse integer identifiers.
    if ((allow_field_number_ || allow_unknown_field_ ||
         allow_unknown_extension_) &&
        LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    ReportError(
        absl::StrCat("Expected identifier, got: ", tokenizer_.current().text));
    return false;
  }